

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseArithmetic(ParseContext *ctx)

{
  SmallArray<SynBinaryOpElement,_32U> *this;
  uint uVar1;
  LexemeType type;
  SynBinaryOpType SVar2;
  Lexeme *begin;
  SynBinaryOpType SVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  SynBase *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar7;
  uint uVar8;
  SynBase *pSVar9;
  SynBinaryOpElement *pSVar10;
  Lexeme *pLVar11;
  undefined4 extraout_var_01;
  
  this_00 = ParseTerminal(ctx);
  if (this_00 == (SynBase *)0x0) {
    this_00 = (SynBase *)0x0;
  }
  else {
    this = &ctx->binaryOpStack;
    uVar1 = (ctx->binaryOpStack).count;
    do {
      begin = ctx->currentLexeme;
      type = begin->type;
      SVar3 = GetBinaryOpType(type);
      if (SVar3 == SYN_BINARY_OP_UNKNOWN) break;
      pLVar11 = begin;
      if (type != lex_none) {
        pLVar11 = begin + 1;
        ctx->currentLexeme = pLVar11;
      }
      uVar8 = (ctx->binaryOpStack).count;
      if (uVar1 < uVar8) {
        uVar4 = GetBinaryOpPrecedence(SVar3);
        pSVar9 = this_00;
        do {
          pSVar10 = this->data;
          uVar5 = GetBinaryOpPrecedence(pSVar10[uVar8 - 1].type);
          this_00 = pSVar9;
          if (uVar4 < uVar5) break;
          pSVar10 = pSVar10 + (uVar8 - 1);
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this_00 = (SynBase *)CONCAT44(extraout_var,iVar6);
          SVar2 = pSVar10->type;
          pSVar7 = pSVar10->value;
          SynBase::SynBase(this_00,0x30,pSVar10->begin,pSVar10->end);
          this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_002229b8;
          *(SynBinaryOpType *)&this_00->field_0x3c = SVar2;
          this_00[1]._vptr_SynBase = (_func_int **)pSVar7;
          *(SynBase **)&this_00[1].typeID = pSVar9;
          uVar8 = (ctx->binaryOpStack).count;
          if (uVar8 == 0) goto LAB_00114c6d;
          uVar8 = uVar8 - 1;
          (ctx->binaryOpStack).count = uVar8;
          pSVar9 = this_00;
        } while (uVar1 < uVar8);
        pLVar11 = ctx->currentLexeme;
      }
      if (pLVar11 <= ctx->firstLexeme) {
LAB_00114c8c:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      if (uVar8 == (ctx->binaryOpStack).max) {
        SmallArray<SynBinaryOpElement,_32U>::grow(this,uVar8);
      }
      pSVar10 = this->data;
      if (pSVar10 == (SynBinaryOpElement *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<SynBinaryOpElement, 32>::push_back(const T &) [T = SynBinaryOpElement, N = 32]"
                     );
      }
      uVar8 = (ctx->binaryOpStack).count;
      (ctx->binaryOpStack).count = uVar8 + 1;
      pSVar10[uVar8].begin = begin;
      pSVar10[uVar8].end = pLVar11 + -1;
      pSVar10[uVar8].type = SVar3;
      pSVar10[uVar8].value = this_00;
      this_00 = ParseTerminal(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_15b62::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after binary operation");
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar6);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00114c8c;
        SynBase::SynBase(this_00,0,begin,ctx->currentLexeme + -1);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
      }
    } while (SVar3 != SYN_BINARY_OP_UNKNOWN);
    uVar8 = (ctx->binaryOpStack).count;
    while (uVar1 < uVar8) {
      pSVar10 = (ctx->binaryOpStack).data;
      uVar8 = uVar8 - 1;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar7 = (SynBase *)CONCAT44(extraout_var_01,iVar6);
      SVar3 = pSVar10[uVar8].type;
      pSVar9 = pSVar10[uVar8].value;
      SynBase::SynBase(pSVar7,0x30,pSVar10[uVar8].begin,pSVar10[uVar8].end);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_002229b8;
      *(SynBinaryOpType *)&pSVar7->field_0x3c = SVar3;
      pSVar7[1]._vptr_SynBase = (_func_int **)pSVar9;
      *(SynBase **)&pSVar7[1].typeID = this_00;
      uVar8 = (ctx->binaryOpStack).count;
      if (uVar8 == 0) {
LAB_00114c6d:
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x183,
                      "void SmallArray<SynBinaryOpElement, 32>::pop_back() [T = SynBinaryOpElement, N = 32]"
                     );
      }
      uVar8 = uVar8 - 1;
      (ctx->binaryOpStack).count = uVar8;
      this_00 = pSVar7;
    }
  }
  return this_00;
}

Assistant:

SynBase* ParseArithmetic(ParseContext &ctx)
{
	SynBase *lhs = ParseTerminal(ctx);

	if(!lhs)
		return NULL;

	unsigned startSize = ctx.binaryOpStack.size();

	while(SynBinaryOpType binaryOp = GetBinaryOpType(ctx.Peek()))
	{
		Lexeme *start = ctx.currentLexeme;

		ctx.Skip();

		while(ctx.binaryOpStack.size() > startSize && GetBinaryOpPrecedence(ctx.binaryOpStack.back().type) <= GetBinaryOpPrecedence(binaryOp))
		{
			SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

			lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

			ctx.binaryOpStack.pop_back();
		}

		ctx.binaryOpStack.push_back(SynBinaryOpElement(start, ctx.Previous(), binaryOp, lhs));

		lhs = ParseTerminal(ctx);

		if(!lhs)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after binary operation");

			lhs = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}
	}

	while(ctx.binaryOpStack.size() > startSize)
	{
		SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

		lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

		ctx.binaryOpStack.pop_back();
	}

	return lhs;
}